

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double discrete_mean(int a,double *b)

{
  double dVar1;
  double local_30;
  double mean;
  int j;
  double b_sum;
  double *b_local;
  int a_local;
  
  dVar1 = r8vec_sum(a,b);
  local_30 = 0.0;
  for (mean._4_4_ = 0; mean._4_4_ < a; mean._4_4_ = mean._4_4_ + 1) {
    local_30 = (double)(mean._4_4_ + 1) * b[mean._4_4_] + local_30;
  }
  return local_30 / dVar1;
}

Assistant:

double discrete_mean ( int a, double b[] )

//****************************************************************************80
//
//  Purpose:
//
//    DISCRETE_MEAN evaluates the mean of the Discrete PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the number of probabilities assigned.
//
//    Input, double B[A], the relative probabilities of
//    outcomes 1 through A.  Each entry must be nonnegative.
//
//    Output, double DISCRETE_MEAN, the mean of the PDF.
//
{
  double b_sum;
  int j;
  double mean;

  b_sum = r8vec_sum ( a, b );

  mean = 0.0;
  for ( j = 0; j < a; j++ )
  {
    mean = mean + static_cast<double>(j + 1 ) * b[j];
  }

  mean = mean / b_sum;

  return mean;
}